

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
::get_ubjson_size_type
          (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           *this,pair<unsigned_long,_int> *result)

{
  size_t byte_;
  json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_00;
  bool bVar1;
  int iVar2;
  string last_token;
  string local_c8;
  parse_error local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  result->first = 0xffffffffffffffff;
  result->second = 0;
  do {
    this->chars_read = this->chars_read + 1;
    iVar2 = (**((this->ia).
                super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_vptr_input_adapter_protocol)();
    this->current = iVar2;
  } while (iVar2 == 0x4e);
  if (iVar2 == 0x23) {
LAB_0010f11c:
    bVar1 = get_ubjson_size_value(this,&result->first);
    return bVar1;
  }
  if (iVar2 == 0x24) {
    this->chars_read = this->chars_read + 1;
    iVar2 = (**((this->ia).
                super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_vptr_input_adapter_protocol)();
    this->current = iVar2;
    result->second = iVar2;
    bVar1 = unexpect_eof(this,ubjson,"type");
    if (bVar1) {
      do {
        this->chars_read = this->chars_read + 1;
        iVar2 = (**((this->ia).
                    super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_vptr_input_adapter_protocol)();
        this->current = iVar2;
      } while (iVar2 == 0x4e);
      if (iVar2 == 0x23) goto LAB_0010f11c;
      bVar1 = unexpect_eof(this,ubjson,"value");
      if (bVar1) {
        get_token_string(&local_40,this);
        byte_ = this->chars_read;
        this_00 = this->sax;
        std::operator+(&local_80,"expected \'#\' after type information; last byte: 0x",&local_40);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"size","");
        exception_message(&local_60,this,ubjson,&local_80,&local_c8);
        parse_error::create(&local_a8,0x70,byte_,&local_60);
        bVar1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::parse_error(this_00,byte_,&local_40,&local_a8.super_exception);
        local_a8.super_exception._0_8_ = &PTR__exception_0011db80;
        std::runtime_error::~runtime_error((runtime_error *)((long)&local_a8 + 0x10));
        std::exception::~exception((exception *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p == &local_40.field_2) {
          return bVar1;
        }
        operator_delete(local_40._M_dataplus._M_p);
        return bVar1;
      }
    }
    bVar1 = false;
  }
  else {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool get_ubjson_size_type(std::pair<std::size_t, int>& result)
    {
        result.first = string_t::npos; // size
        result.second = 0; // type

        get_ignore_noop();

        if (current == '$')
        {
            result.second = get();  // must not ignore 'N', because 'N' maybe the type
            if (JSON_HEDLEY_UNLIKELY(not unexpect_eof(input_format_t::ubjson, "type")))
            {
                return false;
            }

            get_ignore_noop();
            if (JSON_HEDLEY_UNLIKELY(current != '#'))
            {
                if (JSON_HEDLEY_UNLIKELY(not unexpect_eof(input_format_t::ubjson, "value")))
                {
                    return false;
                }
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read, exception_message(input_format_t::ubjson, "expected '#' after type information; last byte: 0x" + last_token, "size")));
            }

            return get_ubjson_size_value(result.first);
        }

        if (current == '#')
        {
            return get_ubjson_size_value(result.first);
        }

        return true;
    }